

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

Result<wasm::Ok> *
wasm::WATParser::anon_unknown_12::doParseModule
          (Result<wasm::Ok> *__return_storage_ptr__,Module *wasm,Lexer *input,bool allowExtra)

{
  uint uVar1;
  _Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  *p_Var2;
  pointer pDVar3;
  Lexer *input_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::Name,_unsigned_int>,_false,_true>,_bool>
  pVar4;
  undefined1 local_448 [8];
  ParseDeclsCtx decls;
  string local_250;
  undefined1 local_230 [8];
  Result<wasm::Ok> _val;
  undefined8 uStack_200;
  __index_type local_1f8;
  bool local_148;
  undefined1 local_140 [8];
  Result<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>
  typeIndices;
  unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
  implicitTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> types;
  undefined1 auStack_a8 [8];
  unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
  typeNames;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  allocator<char> local_31;
  
  ParseDeclsCtx::ParseDeclsCtx((ParseDeclsCtx *)local_448,input,wasm);
  parseDecls((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)local_140,(string *)local_230);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_140);
    std::__cxx11::string::~string((string *)local_140);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
    goto LAB_00c88b73;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
  if ((!allowExtra) &&
     (local_448 !=
      (undefined1  [8])
      decls.in.file.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._32_8_)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"Unexpected tokens after module",(allocator<char> *)local_140);
    Lexer::err((Err *)local_230,(Lexer *)local_448,&local_250);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_230);
    std::__cxx11::string::~string((string *)local_230);
    std::__cxx11::string::~string((string *)&local_250);
    goto LAB_00c88b73;
  }
  local_230 = (undefined1  [8])&uStack_200;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = 1;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._8_8_ = 0;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._16_8_ = 0;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._24_4_ = 0x3f800000;
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _M_index = '\0';
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _33_7_ = 0;
  uStack_200 = (__node_base_ptr)0x0;
  typeNames._M_h._M_single_bucket = (__node_base_ptr)input;
  for (pDVar3 = decls.recTypeDefs.
                super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pDVar3 != decls.typeDefs.
                super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                ._M_impl.super__Vector_impl_data._M_start; pDVar3 = pDVar3 + 1) {
    if ((pDVar3->name).super_IString.str._M_str != (char *)0x0) {
      auStack_a8 = (undefined1  [8])(pDVar3->name).super_IString.str._M_len;
      typeNames._M_h._M_buckets = (__buckets_ptr)(pDVar3->name).super_IString.str._M_str;
      typeNames._M_h._M_bucket_count = CONCAT44(typeNames._M_h._M_bucket_count._4_4_,pDVar3->index);
      pVar4 = std::
              _Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<wasm::Name_const,unsigned_int>>
                        ((_Hashtable<wasm::Name,std::pair<wasm::Name_const,unsigned_int>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)local_230,auStack_a8);
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar1 = pDVar3->pos;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&typeIndices.val.
                           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                   + 0x38),"duplicate element name",(allocator<char> *)&local_60);
        Lexer::err((Err *)auStack_a8,(Lexer *)local_448,(ulong)uVar1,
                   (string *)
                   ((long)&typeIndices.val.
                           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                   + 0x38));
        input_00 = (Lexer *)typeNames._M_h._M_single_bucket;
        std::__detail::__variant::
        _Variant_storage<false,std::unordered_map<wasm::Name,unsigned_int,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>>,wasm::Err>
        ::_Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,std::unordered_map<wasm::Name,unsigned_int,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>>,wasm::Err>
                    *)local_140,auStack_a8);
        std::__cxx11::string::~string((string *)auStack_a8);
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&typeIndices.val.
                           super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                   + 0x38));
        goto LAB_00c88853;
      }
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,std::unordered_map<wasm::Name,unsigned_int,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>>,wasm::Err>
  ::
  _Variant_storage<0ul,std::unordered_map<wasm::Name,unsigned_int,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>>>
            ((_Variant_storage<false,std::unordered_map<wasm::Name,unsigned_int,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,unsigned_int>>>,wasm::Err>
              *)local_140,local_230);
  input_00 = (Lexer *)typeNames._M_h._M_single_bucket;
LAB_00c88853:
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_230);
  std::__detail::__variant::
  _Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     *)local_230,
                    (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                     *)local_140);
  if (local_1f8 == '\x01') {
    std::__cxx11::string::string((string *)auStack_a8,(string *)local_230);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,auStack_a8);
    std::__cxx11::string::~string((string *)auStack_a8);
    std::__detail::__variant::
    _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         *)local_230);
  }
  else {
    std::__detail::__variant::
    _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         *)local_230);
    implicitTypes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    auStack_a8 = (undefined1  [8])&typeNames._M_h._M_rehash_policy._M_next_resize;
    typeNames._M_h._M_buckets = (__buckets_ptr)0x1;
    typeNames._M_h._M_bucket_count = 0;
    typeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    typeNames._M_h._M_element_count._0_4_ = 0x3f800000;
    typeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    typeNames._M_h._M_rehash_policy._4_4_ = 0;
    typeNames._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
              *)0x0;
    if (typeIndices.val.
        super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
        .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
        super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u.
        _M_first._M_storage._M_storage[0x30] == '\0') {
      p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                *)local_140;
    }
    parseTypeDefs((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input_00,
                  (IndexMap *)p_Var2,
                  (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                  &implicitTypes._M_h._M_single_bucket,
                  (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                   *)auStack_a8);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x38),(string *)local_230);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x38));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&typeIndices.val.
                         super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                         .
                         super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                         .
                         super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                 + 0x38));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
      typeIndices.val.
      super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
      .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
      super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._56_8_ =
           &implicitTypes._M_h._M_rehash_policy._M_next_resize;
      implicitTypes._M_h._M_buckets = (__buckets_ptr)0x1;
      implicitTypes._M_h._M_bucket_count = 0;
      implicitTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      implicitTypes._M_h._M_element_count._0_4_ = 0x3f800000;
      implicitTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      implicitTypes._M_h._M_rehash_policy._4_4_ = 0;
      implicitTypes._M_h._M_rehash_policy._M_next_resize = 0;
      p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                *)0x0;
      if (typeIndices.val.
          super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
          .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
          super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>._M_u
          ._M_first._M_storage._M_storage[0x30] == '\0') {
        p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)local_140;
      }
      parseImplicitTypeDefs
                ((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input_00,
                 (IndexMap *)p_Var2,
                 (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &implicitTypes._M_h._M_single_bucket,
                 (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                  *)((long)&typeIndices.val.
                            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                            .
                            super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                    + 0x38));
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string((string *)&local_60,(string *)local_230);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_60);
LAB_00c88b2e:
        std::__cxx11::string::~string((string *)&local_60);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
        p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)0x0;
        if (typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    *)local_140;
        }
        parseModuleTypes((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input_00,
                         (IndexMap *)p_Var2,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &implicitTypes._M_h._M_single_bucket,
                         (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                          *)((long)&typeIndices.val.
                                    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            + 0x38));
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string((string *)&local_60,(string *)local_230);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_60)
          ;
          goto LAB_00c88b2e;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
        p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                  *)0x0;
        if (typeIndices.val.
            super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
            .super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            super__Variant_storage_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>.
            _M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var2 = (_Copy_ctor_base<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                    *)local_140;
        }
        parseDefinitions((Result<wasm::Ok> *)local_230,(ParseDeclsCtx *)local_448,input_00,
                         (IndexMap *)p_Var2,
                         (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                         &implicitTypes._M_h._M_single_bucket,
                         (unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
                          *)((long)&typeIndices.val.
                                    super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                                    .
                                    super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                            + 0x38),
                         (unordered_map<wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>_>
                          *)auStack_a8);
        if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
          std::__cxx11::string::string((string *)&local_60,(string *)local_230);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
          _Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_60)
          ;
          goto LAB_00c88b2e;
        }
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_230);
        PassRunner::PassRunner((PassRunner *)local_230,wasm);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&decls.tagCounter,"propagate-debug-locs",&local_31);
        local_60._M_engaged = false;
        PassRunner::add((PassRunner *)local_230,(string *)&decls.tagCounter,
                        (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_60);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset(&local_60);
        std::__cxx11::string::~string((string *)&decls.tagCounter);
        local_148 = true;
        PassRunner::run((PassRunner *)local_230);
        PassRunner::~PassRunner((PassRunner *)local_230);
        Lexer::operator=(input_00,(Lexer *)local_448);
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::HeapType>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)&typeIndices.val.
                               super__Variant_base<std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::unordered_map<wasm::Name,_unsigned_int>,_wasm::Err>
                       + 0x38));
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_a8);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &implicitTypes._M_h._M_single_bucket);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>,_wasm::Err>
                       *)local_140);
LAB_00c88b73:
  ParseDeclsCtx::~ParseDeclsCtx((ParseDeclsCtx *)local_448);
  return __return_storage_ptr__;
}

Assistant:

Result<> doParseModule(Module& wasm, Lexer& input, bool allowExtra) {
  ParseDeclsCtx decls(input, wasm);
  CHECK_ERR(parseDecls(decls));
  if (!allowExtra && !decls.in.empty()) {
    return decls.in.err("Unexpected tokens after module");
  }

  auto typeIndices = createIndexMap(decls.in, decls.typeDefs);
  CHECK_ERR(typeIndices);

  std::vector<HeapType> types;
  std::unordered_map<HeapType, std::unordered_map<Name, Index>> typeNames;
  CHECK_ERR(parseTypeDefs(decls, input, *typeIndices, types, typeNames));

  std::unordered_map<Index, HeapType> implicitTypes;
  CHECK_ERR(
    parseImplicitTypeDefs(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseModuleTypes(decls, input, *typeIndices, types, implicitTypes));

  CHECK_ERR(parseDefinitions(
    decls, input, *typeIndices, types, implicitTypes, typeNames));

  propagateDebugLocations(wasm);
  input = decls.in;

  return Ok{};
}